

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char> __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::buffer_appender<char>>
          (float_writer<char> *this,buffer_appender<char> it)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  buffer_appender<char> bVar6;
  uint uVar7;
  int iVar8;
  char *__last;
  char *__first;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  iVar10 = this->num_digits_;
  iVar11 = this->exp_;
  uVar7 = iVar11 + iVar10;
  if ((this->specs_).field_0x4 == '\x01') {
    cVar1 = *this->digits_;
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar4 + 1;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = cVar1;
    iVar10 = (this->specs_).precision - this->num_digits_;
    if ((1 < this->num_digits_) || (((this->specs_).field_0x6 & 0x10) != 0)) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      cVar1 = this->decimal_point_;
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
    }
    bVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                      (this->digits_ + 1,this->digits_ + this->num_digits_,it);
    if ((0 < iVar10) && (((this->specs_).field_0x6 & 0x10) != 0)) {
      iVar10 = iVar10 + 1;
      do {
        if (*(ulong *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        lVar4 = *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) = lVar4 + 1;
        *(undefined1 *)
         (*(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 8) + lVar4) = 0x30;
        iVar10 = iVar10 + -1;
      } while (1 < iVar10);
    }
    bVar2 = (this->specs_).field_0x6;
    if (*(ulong *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) <
        *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar4 = *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    *(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
             0x10) = lVar4 + 1;
    *(byte *)(*(long *)((long)bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = ((bVar2 & 1) == 0) << 5 | 0x45;
    bVar6 = write_exponent<char,fmt::v7::detail::buffer_appender<char>>(uVar7 - 1,bVar6);
    return (buffer_appender<char>)
           bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  if (iVar11 < 0) {
    if ((int)uVar7 < 1) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
       + lVar4) = 0x30;
      iVar10 = -uVar7;
      uVar12 = (ulong)(uint)this->num_digits_;
      if (uVar12 == 0) {
        iVar11 = (this->specs_).precision;
        iVar8 = iVar10;
        if (SBORROW4(iVar11,iVar10) != (int)(iVar11 + uVar7) < 0) {
          iVar8 = iVar11;
        }
        if (-1 < iVar11) {
          iVar10 = iVar8;
        }
      }
      uVar7 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
      if (0 < this->num_digits_ && (char)(uVar7 >> 0x14) == '\0') {
        do {
          if (this->digits_[uVar12 - 1] != '0') goto LAB_00116ba6;
          bVar5 = 1 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar5);
        uVar12 = 0;
      }
LAB_00116ba6:
      if ((uVar7 != 0 || iVar10 != 0) || (int)uVar12 != 0) {
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) <
            *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        cVar1 = this->decimal_point_;
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) = lVar4 + 1;
        *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 8) + lVar4) = cVar1;
        if (0 < iVar10) {
          iVar10 = iVar10 + 1;
          do {
            if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                 container + 0x18) <
                *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + 1U) {
              (*(code *)**(undefined8 **)
                          it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                        (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
            }
            lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10);
            *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10) = lVar4 + 1;
            *(undefined1 *)
             (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar4) = 0x30;
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        __first = this->digits_;
        __last = __first + (int)uVar12;
        goto LAB_00116c1b;
      }
    }
    else {
      uVar12 = (ulong)uVar7;
      it = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                     (this->digits_,this->digits_ + uVar12,it);
      if (((this->specs_).field_0x6 & 0x10) == 0) {
        uVar3 = this->num_digits_;
        uVar9 = (ulong)uVar3;
        if ((int)uVar7 < (int)uVar3) {
          uVar9 = (ulong)(int)uVar3;
          do {
            if (this->digits_[uVar9 - 1] != '0') goto LAB_00116aef;
            uVar9 = uVar9 - 1;
          } while ((long)uVar12 < (long)uVar9);
          uVar9 = (ulong)uVar7;
        }
LAB_00116aef:
        if ((uint)uVar9 != uVar7) {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          cVar1 = this->decimal_point_;
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 8) + lVar4) = cVar1;
        }
        __first = this->digits_ + uVar12;
        __last = this->digits_ + (int)(uint)uVar9;
LAB_00116c1b:
        bVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>(__first,__last,it);
        return (buffer_appender<char>)
               bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      }
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      cVar1 = this->decimal_point_;
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
      it = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                     (this->digits_ + uVar12,this->digits_ + this->num_digits_,it);
      iVar10 = (this->specs_).precision;
      iVar11 = this->num_digits_;
      iVar8 = iVar10 - iVar11;
      if ((iVar8 != 0 && iVar11 <= iVar10) && (iVar8 != 0 && iVar11 <= iVar10)) {
        iVar8 = iVar8 + 1;
        do {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(undefined1 *)
           (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = 0x30;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
    }
  }
  else {
    it = std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                   (this->digits_,this->digits_ + iVar10,it);
    if (this->num_digits_ < (int)uVar7) {
      iVar10 = ((iVar11 + iVar10) - this->num_digits_) + 1;
      do {
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) <
            *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) = lVar4 + 1;
        *(undefined1 *)
         (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   8) + lVar4) = 0x30;
        iVar10 = iVar10 + -1;
      } while (1 < iVar10);
    }
    if ((((this->specs_).field_0x6 & 0x10) != 0) || ((this->specs_).precision < 0)) {
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      cVar1 = this->decimal_point_;
      lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
               ) = lVar4 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 8) + lVar4) = cVar1;
      iVar10 = (this->specs_).precision;
      iVar11 = iVar10 - uVar7;
      if (iVar11 == 0 || iVar10 < (int)uVar7) {
        if ((this->specs_).field_0x4 != '\x02') {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(undefined1 *)
           (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = 0x30;
        }
      }
      else {
        iVar11 = iVar11 + 1;
        do {
          if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          lVar4 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10) = lVar4 + 1;
          *(undefined1 *)
           (*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar4) = 0x30;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
      }
    }
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }